

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O3

int AF_A_SmBounce(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  PClass *pPVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  undefined8 *puVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ddac1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar7 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar7 == (undefined8 *)0x0) {
LAB_005dd944:
        puVar7 = (undefined8 *)0x0;
        pVVar8 = param;
      }
      else {
        auVar11._8_8_ = uVar6;
        auVar11._0_8_ = puVar7[1];
        if (puVar7[1] == 0) {
          auVar11 = (**(code **)*puVar7)(puVar7);
          puVar7[1] = auVar11._0_8_;
        }
        pPVar5 = auVar11._0_8_;
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        uVar6 = (ulong)bVar9;
        bVar10 = pPVar5 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ddac1;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005dda04;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ddab1;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar6,ret);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ddac1;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005ddab1;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dda04:
        puVar7[0xb] = (double)puVar7[0x24] + 1.0;
        uVar4 = FRandom::GenRand32(&pr_smbounce);
        puVar7[0x17] = (double)(uVar4 & 0xff) * 0.015625 + 2.0;
        uVar4 = FRandom::GenRand32(&pr_smbounce);
        puVar7[0x15] = (double)(int)(char)((char)uVar4 + (char)((uVar4 & 0xff) / 3) * -3);
        uVar4 = FRandom::GenRand32(&pr_smbounce);
        puVar7[0x16] = (double)(int)(char)((char)uVar4 + (char)((uVar4 & 0xff) / 3) * -3);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ddac1;
    }
    if (puVar7 == (undefined8 *)0x0) goto LAB_005dd944;
  }
LAB_005ddab1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ddac1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0x65,"int AF_A_SmBounce(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SmBounce)
{
	PARAM_ACTION_PROLOGUE;

	// give some more velocity (x,y,&z)
	self->SetZ(self->floorz + 1);
	self->Vel.Z = 2. + pr_smbounce() / 64.;
	self->Vel.X = pr_smbounce() % 3;
	self->Vel.Y = pr_smbounce() % 3;
	return 0;
}